

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

void __thiscall wasm::SubTypes::note(SubTypes *this,HeapType type)

{
  bool bVar1;
  HeapType *__k;
  mapped_type *this_00;
  undefined1 extraout_DL;
  _Storage<wasm::HeapType,_true> local_28;
  optional<wasm::HeapType> super;
  SubTypes *this_local;
  HeapType type_local;
  
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = this;
  this_local = (SubTypes *)type.id;
  local_28 = (_Storage<wasm::HeapType,_true>)wasm::HeapType::getDeclaredSuperType();
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_28._M_value);
  if (bVar1) {
    __k = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&local_28._M_value);
    this_00 = std::
              unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
              ::operator[](&this->typeSubTypes,__k);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (this_00,(value_type *)&this_local);
  }
  return;
}

Assistant:

void note(HeapType type) {
    if (auto super = type.getDeclaredSuperType()) {
      typeSubTypes[*super].push_back(type);
    }
  }